

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peeker.hpp
# Opt level: O2

void __thiscall
boost::xpressive::detail::xpression_peeker<char>::
set_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
          (xpression_peeker<char> *this,
          regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> *tr)

{
  bool bVar1;
  
  if (this->traits_ == (void *)0x0) {
    this->traits_ = tr;
    this->traits_type_ =
         (type_info *)&regex_traits<char,boost::xpressive::cpp_regex_traits<char>>::typeinfo;
    return;
  }
  bVar1 = std::type_info::operator!=
                    (this->traits_type_,
                     (type_info *)
                     &regex_traits<char,boost::xpressive::cpp_regex_traits<char>>::typeinfo);
  if ((!bVar1) &&
     (bVar1 = std::locale::operator!=
                        ((locale *)((long)this->traits_ + 0x200),
                         &(tr->super_cpp_regex_traits<char>).loc_), !bVar1)) {
    return;
  }
  fail(this);
  return;
}

Assistant:

void set_traits(Traits const &tr)
    {
        if(0 == this->traits_)
        {
            this->traits_ = &tr;
            this->traits_type_ = &typeid(Traits);
        }
        else if(*this->traits_type_ != typeid(Traits) || this->get_traits_<Traits>() != tr)
        {
            this->fail(); // traits mis-match! set all and bail
        }
    }